

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O2

CostType __thiscall wasm::CostAnalyzer::visitStructCmpxchg(CostAnalyzer *this,StructCmpxchg *curr)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (curr->ref->type).id;
  uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->ref);
  uVar3 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->expected);
  uVar4 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->replacement);
  return uVar4 + uVar3 + uVar2 + (uint)(((uint)uVar1 & 3) == 2 && 6 < uVar1) + 10;
}

Assistant:

CostType visitStructCmpxchg(StructCmpxchg* curr) {
    return AtomicCost + nullCheckCost(curr->ref) + visit(curr->ref) +
           visit(curr->expected) + visit(curr->replacement);
  }